

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::GetBitFieldName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int index)

{
  AlphaNum *a;
  string sStack_68;
  AlphaNum local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"bitField",(allocator *)&local_48);
  strings::AlphaNum::AlphaNum(&local_48,(int)this);
  StrCat_abi_cxx11_(&sStack_68,(protobuf *)&local_48,a);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBitFieldName(int index) {
  std::string varName = "bitField";
  varName += StrCat(index);
  varName += "_";
  return varName;
}